

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O2

NonAnsiPortSyntax * __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax>::operator[]
          (SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax> *this,size_t index)

{
  reference this_00;
  SyntaxNode *this_01;
  NonAnsiPortSyntax *pNVar1;
  
  this_00 = nonstd::span_lite::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::
            operator[](&this->elements,index * 2);
  this_01 = TokenOrSyntax::node(this_00);
  pNVar1 = SyntaxNode::as<slang::syntax::NonAnsiPortSyntax>(this_01);
  return pNVar1;
}

Assistant:

T* operator[](size_t index) {
        index <<= 1;
        return &elements[index].node()->template as<T>();
    }